

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

void __thiscall
Options::add_entry<int&>
          (Options *this,option *opt,char flag,string *long_flag,string *description,string *group,
          bool req_arg)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int iVar1;
  Options *pOVar2;
  size_type sVar3;
  __type_conflict1 _Var4;
  uint uVar5;
  iterator iVar6;
  iterator iVar7;
  ostream *poVar8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  runtime_error *prVar9;
  uint uVar10;
  ulong uVar11;
  size_type __n;
  ulong __pos;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  allocator<char> local_261;
  Options *local_260;
  string desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string *local_208;
  ulong local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8 [8];
  long local_1d0;
  stringstream ss;
  ostream local_1a8 [376];
  
  local_260 = this;
  local_208 = group;
  if (flag == '\0') {
    if (long_flag->_M_string_length == 0) {
      return;
    }
    iVar1 = this->optval;
    this->optval = iVar1 + 1;
    opt->val = iVar1;
  }
  else {
    _ss = (int)flag;
    iVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
            ::find(&(this->setters)._M_t,(key_type *)&ss);
    if ((_Rb_tree_header *)iVar6._M_node != &(this->setters)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar8 = std::operator<<(local_1a8,"Duplicate flag \'");
      poVar8 = std::operator<<(poVar8,flag);
      std::operator<<(poVar8,"\'");
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar9,(string *)&desc);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&this->optstr,flag);
    if (req_arg) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&this->optstr,":");
    }
    opt->val = (int)flag;
    if (long_flag->_M_string_length == 0) goto LAB_001260bd;
  }
  pOVar2 = local_260;
  this_00 = &local_260->long_flags;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this_00->_M_t,long_flag);
  if ((_Rb_tree_header *)iVar7._M_node != &(pOVar2->long_flags)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar8 = std::operator<<(local_1a8,"Duplicate long flag \"");
    poVar8 = std::operator<<(poVar8,(string *)long_flag);
    std::operator<<(poVar8,"\"");
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar9,(string *)&desc);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar12 = std::
           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
           ::_M_insert_unique<std::__cxx11::string_const&>
                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)this_00,long_flag);
  opt->name = *(char **)(pVar12.first._M_node._M_node + 1);
LAB_001260bd:
  pOVar2 = local_260;
  opt->flag = (int *)0x0;
  if (description->_M_string_length != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    desc._M_dataplus._M_p = (pointer)&desc.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&desc,(ulong)pOVar2->IndentFlag,' ');
    std::operator<<(local_1a8,(string *)&desc);
    std::__cxx11::string::~string((string *)&desc);
    if (flag != '\0') {
      poVar8 = std::operator<<(local_1a8,"-");
      poVar8 = std::operator<<(poVar8,flag);
      std::operator<<(poVar8," ");
    }
    if (long_flag->_M_string_length != 0) {
      poVar8 = std::operator<<(local_1a8,"--");
      poVar8 = std::operator<<(poVar8,(string *)long_flag);
      std::operator<<(poVar8," ");
    }
    std::__cxx11::stringbuf::str();
    sVar3 = local_228._M_string_length;
    uVar11 = (ulong)local_260->IndentDescription;
    if (uVar11 < local_228._M_string_length) {
      __n = 1;
    }
    else {
      std::__cxx11::stringbuf::str();
      __n = uVar11 - local_1d0;
    }
    desc._M_dataplus._M_p = (pointer)&desc.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&desc,__n,' ');
    std::operator<<(local_1a8,(string *)&desc);
    std::__cxx11::string::~string((string *)&desc);
    if (sVar3 <= uVar11) {
      std::__cxx11::string::~string(local_1d8);
    }
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::string((string *)&desc,description);
    pOVar2 = local_260;
    uVar5 = tty_width(local_260);
    std::__cxx11::stringbuf::str();
    if ((float)(uVar5 - local_228._M_string_length) <= (float)uVar5 * 0.3) {
      uVar10 = pOVar2->IndentFlag + 2;
    }
    else {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::~string((string *)&local_1f8);
      uVar10 = (uint)local_1f8._M_string_length;
    }
    std::__cxx11::string::~string((string *)&local_228);
    if (uVar10 == pOVar2->IndentFlag + 2) {
      std::operator<<(local_1a8,'\n');
    }
    local_200 = (ulong)uVar10;
    uVar11 = 0;
    while (__pos = uVar11, uVar11 < desc._M_string_length) {
      while( true ) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_228,&desc,__pos,1);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8," ",&local_261);
        _Var4 = std::operator==(&local_228,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_228);
        if (!_Var4) break;
        __pos = (ulong)((int)__pos + 1);
      }
      uVar11 = (ulong)((uVar5 - uVar10) + (int)__pos);
      if (uVar11 < desc._M_string_length) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_228,&desc,__pos,(ulong)(uVar5 - uVar10));
        poVar8 = std::operator<<(local_1a8,(string *)&local_228);
        poVar8 = std::operator<<(poVar8,'\n');
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_1f8,local_200,' ');
        std::operator<<(poVar8,(string *)&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_228,&desc,__pos,0xffffffffffffffff);
        std::operator<<(local_1a8,(string *)&local_228);
      }
      std::__cxx11::string::~string((string *)&local_228);
    }
    this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[](&local_260->usage,local_208);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_01,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

inline void Options::add_entry(struct option& opt, char flag, std::string long_flag, std::string description, std::string group, bool req_arg) {
    if (!flag && !long_flag.size()) return;

    if (flag) {
        if (this->setters.find((int)(flag)) != this->setters.end()) {
            std::stringstream ss;
            ss << "Duplicate flag '" << flag << "'";
            throw std::runtime_error(ss.str());
        }
        this->optstr += flag;
        if (req_arg) this->optstr += ":";

        opt.val = flag;
    } else {
        opt.val = this->optval++;
    }

    if (long_flag.size()) {
        if (this->long_flags.find(long_flag) != this->long_flags.end()) {
            std::stringstream ss;
            ss << "Duplicate long flag \"" << long_flag << "\"";
            throw std::runtime_error(ss.str());
        }
        opt.name = this->long_flags.insert(long_flag).first->c_str();
    }
    opt.flag = NULL;

    if (description.size()) {
        std::stringstream ss;
        ss << std::string(IndentFlag, ' ');

        if (flag) ss << "-" << flag << " ";
        if (long_flag.size()) ss << "--" << long_flag << " ";
        ss << std::string(ss.str().length() > IndentDescription ? 1 : IndentDescription - ss.str().length(), ' ');

        std::string desc(description);
        if (std::is_same<T, bool&>::value) desc.append(std::string(" <switch>"));

        unsigned width = tty_width();
        unsigned desc_pos = width - ss.str().length() > width * 0.3f ? (unsigned)ss.str().length() : IndentFlag + 2;
        unsigned column_width = width - desc_pos;
        if (desc_pos == IndentFlag + 2) ss << '\n';

        for (unsigned i = 0; i < desc.size(); i += column_width) {
            while (desc.substr(i, 1) == std::string(" ")) ++i;
            if (i + column_width < desc.size()) {
                ss << desc.substr(i, column_width) << '\n' << std::string(desc_pos, ' ');
            } else {
                ss << desc.substr(i);
            }
        }

        this->usage[group].push_back(ss.str());
    }
}